

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_int,_const_char_*>,_int,_std::hash<int>,_google::dense_hash_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_const_char_*>_>_>::SelectKey,_google::dense_hash_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_const_char_*>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_const_char_*>_>_>
::find_position<int>
          (dense_hashtable<std::pair<const_int,_const_char_*>,_int,_std::hash<int>,_google::dense_hash_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_const_char_*>_>_>::SelectKey,_google::dense_hash_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_const_char_*>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_const_char_*>_>_>
           *this,int *key)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  uVar4 = (ulong)*key;
  uVar2 = 0xffffffffffffffff;
  lVar3 = 1;
  uVar5 = 0xffffffffffffffff;
  while( true ) {
    uVar4 = uVar4 & this->num_buckets - 1;
    iVar1 = this->table[uVar4].first;
    if ((this->key_info).empty_key == iVar1) break;
    if ((this->num_deleted == 0) || ((this->key_info).delkey != iVar1)) {
      if (*key == iVar1) goto LAB_009c98b7;
    }
    else if (uVar5 == 0xffffffffffffffff) {
      uVar5 = uVar4;
    }
    uVar4 = uVar4 + lVar3;
    lVar3 = lVar3 + 1;
  }
  uVar2 = uVar4;
  if (uVar5 != 0xffffffffffffffff) {
    uVar2 = uVar5;
  }
  uVar4 = 0xffffffffffffffff;
LAB_009c98b7:
  pVar6.second = uVar2;
  pVar6.first = uVar4;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }